

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

Error * ot::commissioner::CommissionerImpl::DecodePendingOperationalDataset
                  (Error *__return_storage_ptr__,PendingOperationalDataset *aDataset,
                  Response *aResponse)

{
  ErrorCode EVar1;
  Tlv *pTVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  uint8_t *puVar4;
  mapped_type *pmVar5;
  ByteArray *pBVar6;
  unsigned_long aValue;
  Timestamp TVar7;
  TlvSet tlvSet;
  PendingOperationalDataset dataset;
  undefined1 local_168 [8];
  _Alloc_hider local_160;
  char local_150 [16];
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  local_140;
  PendingOperationalDataset local_110;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_140._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_140._M_impl.super__Rb_tree_header._M_header;
  local_140._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_140._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_140._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_140._M_impl.super__Rb_tree_header._M_header._M_right =
       local_140._M_impl.super__Rb_tree_header._M_header._M_left;
  PendingOperationalDataset::PendingOperationalDataset(&local_110);
  local_110.super_ActiveOperationalDataset.mPresentFlags = 0;
  DecodeActiveOperationalDataset
            ((Error *)local_168,&local_110.super_ActiveOperationalDataset,&aResponse->mPayload);
  __return_storage_ptr__->mCode = local_168._0_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_160);
  EVar1 = __return_storage_ptr__->mCode;
  if (local_160._M_p != local_150) {
    operator_delete(local_160._M_p);
  }
  if (EVar1 == kNone) {
    tlv::GetTlvSet((Error *)local_168,(TlvSet *)&local_140,&aResponse->mPayload,kMeshCoP);
    __return_storage_ptr__->mCode = local_168._0_4_;
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->mMessage,(string *)&local_160);
    EVar1 = __return_storage_ptr__->mCode;
    if (local_160._M_p != local_150) {
      operator_delete(local_160._M_p);
    }
    if (EVar1 == kNone) {
      local_168[0] = 0x34;
      pmVar5 = std::
               map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
               ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                             *)&local_140,local_168);
      pTVar2 = (pmVar5->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      p_Var3 = (pmVar5->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      if (pTVar2 != (Tlv *)0x0) {
        pBVar6 = tlv::Tlv::GetValue(pTVar2);
        puVar4 = (pBVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        local_110.super_ActiveOperationalDataset._212_4_ =
             utils::Decode<unsigned_int>
                       (puVar4,(long)(pBVar6->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)puVar4);
        local_110.super_ActiveOperationalDataset.mPresentFlags =
             local_110.super_ActiveOperationalDataset.mPresentFlags | 0x20;
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      local_168[0] = 0x33;
      pmVar5 = std::
               map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
               ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                             *)&local_140,local_168);
      pTVar2 = (pmVar5->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      p_Var3 = (pmVar5->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      if (pTVar2 != (Tlv *)0x0) {
        pBVar6 = tlv::Tlv::GetValue(pTVar2);
        puVar4 = (pBVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        aValue = utils::Decode<unsigned_long>
                           (puVar4,(long)(pBVar6->
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)puVar4)
        ;
        TVar7 = Timestamp::Decode(aValue);
        local_110.mPendingTimestamp._0_4_ = TVar7._0_4_;
        local_110.mPendingTimestamp._4_4_ = TVar7._4_4_;
        local_110.super_ActiveOperationalDataset.mPresentFlags =
             local_110.super_ActiveOperationalDataset.mPresentFlags | 0x10;
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      (aDataset->super_ActiveOperationalDataset).mActiveTimestamp =
           local_110.super_ActiveOperationalDataset.mActiveTimestamp;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&(aDataset->super_ActiveOperationalDataset).mExtendedPanId,
                 &local_110.super_ActiveOperationalDataset.mExtendedPanId);
      (aDataset->super_ActiveOperationalDataset).mPanId =
           local_110.super_ActiveOperationalDataset.mPanId;
      std::__cxx11::string::_M_assign
                ((string *)&(aDataset->super_ActiveOperationalDataset).mNetworkName);
      (aDataset->super_ActiveOperationalDataset).mChannel =
           local_110.super_ActiveOperationalDataset.mChannel;
      std::
      vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ::operator=(&(aDataset->super_ActiveOperationalDataset).mChannelMask,
                  &local_110.super_ActiveOperationalDataset.mChannelMask);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&(aDataset->super_ActiveOperationalDataset).mMeshLocalPrefix,
                 &local_110.super_ActiveOperationalDataset.mMeshLocalPrefix);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&(aDataset->super_ActiveOperationalDataset).mNetworkMasterKey,
                 &local_110.super_ActiveOperationalDataset.mNetworkMasterKey);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&(aDataset->super_ActiveOperationalDataset).mPSKc,
                 &local_110.super_ActiveOperationalDataset.mPSKc);
      (aDataset->super_ActiveOperationalDataset).mSecurityPolicy.mRotationTime =
           local_110.super_ActiveOperationalDataset.mSecurityPolicy.mRotationTime;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&(aDataset->super_ActiveOperationalDataset).mSecurityPolicy.mFlags,
                 &local_110.super_ActiveOperationalDataset.mSecurityPolicy.mFlags);
      (aDataset->super_ActiveOperationalDataset).mPresentFlags =
           local_110.super_ActiveOperationalDataset.mPresentFlags;
      *(ulong *)&(aDataset->super_ActiveOperationalDataset).field_0xd4 =
           CONCAT44(local_110.mPendingTimestamp._0_4_,
                    local_110.super_ActiveOperationalDataset._212_4_);
      *(undefined4 *)&(aDataset->mPendingTimestamp).field_0x4 = local_110.mPendingTimestamp._4_4_;
    }
  }
  if (local_110.super_ActiveOperationalDataset.mSecurityPolicy.mFlags.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super_ActiveOperationalDataset.mSecurityPolicy.mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_110.super_ActiveOperationalDataset.mPSKc.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super_ActiveOperationalDataset.mPSKc.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_110.super_ActiveOperationalDataset.mNetworkMasterKey.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super_ActiveOperationalDataset.mNetworkMasterKey.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_110.super_ActiveOperationalDataset.mMeshLocalPrefix.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super_ActiveOperationalDataset.mMeshLocalPrefix.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  ~vector(&local_110.super_ActiveOperationalDataset.mChannelMask);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.super_ActiveOperationalDataset.mNetworkName._M_dataplus._M_p !=
      &local_110.super_ActiveOperationalDataset.mNetworkName.field_2) {
    operator_delete(local_110.super_ActiveOperationalDataset.mNetworkName._M_dataplus._M_p);
  }
  if (local_110.super_ActiveOperationalDataset.mExtendedPanId.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super_ActiveOperationalDataset.mExtendedPanId.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~_Rb_tree(&local_140);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::DecodePendingOperationalDataset(PendingOperationalDataset &aDataset,
                                                        const coap::Response      &aResponse)
{
    Error                     error;
    tlv::TlvSet               tlvSet;
    PendingOperationalDataset dataset;

    // Clear all data fields
    dataset.mPresentFlags = 0;

    SuccessOrExit(error = DecodeActiveOperationalDataset(dataset, aResponse.GetPayload()));
    SuccessOrExit(error = GetTlvSet(tlvSet, aResponse));

    if (auto delayTimer = tlvSet[tlv::Type::kDelayTimer])
    {
        dataset.mDelayTimer = utils::Decode<uint32_t>(delayTimer->GetValue());
        dataset.mPresentFlags |= PendingOperationalDataset::kDelayTimerBit;
    }

    if (auto pendingTimestamp = tlvSet[tlv::Type::kPendingTimestamp])
    {
        uint64_t value;
        value                     = utils::Decode<uint64_t>(pendingTimestamp->GetValue());
        dataset.mPendingTimestamp = Timestamp::Decode(value);
        dataset.mPresentFlags |= PendingOperationalDataset::kPendingTimestampBit;
    }

    aDataset = dataset;

exit:
    return error;
}